

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy-fp.h
# Opt level: O2

void __thiscall FIX::double_conversion::DiyFp::Normalize(DiyFp *this)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = this->f_;
  if (uVar1 != 0) {
    iVar2 = this->e_;
    for (; uVar1 >> 0x36 == 0; uVar1 = uVar1 << 10) {
      iVar2 = iVar2 + -10;
    }
    for (; -1 < (long)uVar1; uVar1 = uVar1 * 2) {
      iVar2 = iVar2 + -1;
    }
    this->f_ = uVar1;
    this->e_ = iVar2;
    return;
  }
  __assert_fail("f_ != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/diy-fp.h"
                ,0x4e,"void FIX::double_conversion::DiyFp::Normalize()");
}

Assistant:

void Normalize() {
    ASSERT(f_ != 0);
    uint64_t significand = f_;
    int exponent = e_;

    // This method is mainly called for normalizing boundaries. In general
    // boundaries need to be shifted by 10 bits. We thus optimize for this case.
    const uint64_t k10MSBits = UINT64_2PART_C(0xFFC00000, 00000000);
    while ((significand & k10MSBits) == 0) {
      significand <<= 10;
      exponent -= 10;
    }
    while ((significand & kUint64MSB) == 0) {
      significand <<= 1;
      exponent--;
    }
    f_ = significand;
    e_ = exponent;
  }